

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigInter.c
# Opt level: O2

void Aig_ManInterFast(Aig_Man_t *pManOn,Aig_Man_t *pManOff,int fVerbose)

{
  uint __line;
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  long lVar6;
  char *__assertion;
  int Lits [3];
  
  if (pManOn->nObjs[2] == pManOff->nObjs[2]) {
    iVar1 = pManOn->nObjs[3];
    if (iVar1 == pManOff->nObjs[3]) {
      pManOn->nRegs = iVar1;
      p = Cnf_Derive(pManOn,iVar1);
      pManOn->nRegs = 0;
      pManOff->nRegs = pManOn->nObjs[3];
      p_00 = Cnf_Derive(pManOff,pManOff->nObjs[3]);
      pManOff->nRegs = 0;
      Cnf_DataLift(p_00,p->nVars);
      s = sat_solver_new();
      sat_solver_setnvars(s,p_00->nVars + p->nVars);
      lVar6 = 0;
      do {
        if (p->nClauses <= lVar6) {
          lVar6 = 0;
          goto LAB_005732c7;
        }
        iVar1 = sat_solver_addclause(s,p->pClauses[lVar6],p->pClauses[lVar6 + 1]);
        lVar6 = lVar6 + 1;
      } while (iVar1 != 0);
      goto LAB_005732f0;
    }
    __assertion = "Aig_ManCoNum(pManOn) == Aig_ManCoNum(pManOff)";
    __line = 0x3c;
  }
  else {
    __assertion = "Aig_ManCiNum(pManOn) == Aig_ManCiNum(pManOff)";
    __line = 0x3b;
  }
  goto LAB_005734f3;
  while( true ) {
    iVar1 = sat_solver_addclause(s,p_00->pClauses[lVar6],p_00->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
    if (iVar1 == 0) break;
LAB_005732c7:
    if (p_00->nClauses <= lVar6) {
      iVar1 = 0;
      goto LAB_00573336;
    }
  }
LAB_005732f0:
  Cnf_DataFree(p);
  Cnf_DataFree(p_00);
  sat_solver_delete(s);
  return;
  while( true ) {
    pvVar3 = Vec_PtrEntry(pManOn->vCis,iVar1);
    pAVar4 = Aig_ManCi(pManOff,iVar1);
    Lits[0] = p->pVarNums[*(int *)((long)pvVar3 + 0x24)] * 2;
    Lits[1] = p_00->pVarNums[pAVar4->Id] * 2 + 1;
    iVar2 = sat_solver_addclause(s,Lits,Lits + 2);
    if (iVar2 == 0) {
      __assertion = "0";
      __line = 0x70;
      goto LAB_005734f3;
    }
    Lits[0] = p->pVarNums[*(int *)((long)pvVar3 + 0x24)] * 2 + 1;
    Lits[1] = p_00->pVarNums[pAVar4->Id] * 2;
    iVar2 = sat_solver_addclause(s,Lits,Lits + 2);
    iVar1 = iVar1 + 1;
    if (iVar2 == 0) break;
LAB_00573336:
    if (pManOn->vCis->nSize <= iVar1) {
      iVar1 = sat_solver_simplify(s);
      if (iVar1 != 0) {
        for (iVar1 = 0; iVar1 < pManOn->vCos->nSize; iVar1 = iVar1 + 1) {
          pvVar3 = Vec_PtrEntry(pManOn->vCos,iVar1);
          pvVar5 = Vec_PtrEntry(pManOff->vCos,iVar1);
          Lits[0] = p->pVarNums[*(int *)((long)pvVar3 + 0x24)] * 2;
          Lits[1] = p_00->pVarNums[*(int *)((long)pvVar5 + 0x24)] * 2;
          iVar2 = sat_solver_solve(s,Lits,Lits + 2,0,0,0,0);
          if (iVar2 != -1) {
            puts("The incremental SAT problem is not UNSAT.");
          }
        }
        Cnf_DataFree(p);
        Cnf_DataFree(p_00);
        sat_solver_delete(s);
        return;
      }
      __assertion = "status != 0";
      __line = 0x77;
      goto LAB_005734f3;
    }
  }
  __assertion = "0";
  __line = 0x74;
LAB_005734f3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigInter.c"
                ,__line,"void Aig_ManInterFast(Aig_Man_t *, Aig_Man_t *, int)");
}

Assistant:

void Aig_ManInterFast( Aig_Man_t * pManOn, Aig_Man_t * pManOff, int fVerbose )
{
    sat_solver * pSat;
    Cnf_Dat_t * pCnfOn, * pCnfOff;
    Aig_Obj_t * pObj, * pObj2;
    int Lits[3], status, i;
//    abctime clk = Abc_Clock();

    assert( Aig_ManCiNum(pManOn) == Aig_ManCiNum(pManOff) );
    assert( Aig_ManCoNum(pManOn) == Aig_ManCoNum(pManOff) );

    // derive CNFs
    pManOn->nRegs = Aig_ManCoNum(pManOn);
    pCnfOn  = Cnf_Derive( pManOn, Aig_ManCoNum(pManOn) );
    pManOn->nRegs = 0;

    pManOff->nRegs = Aig_ManCoNum(pManOn);
    pCnfOff = Cnf_Derive( pManOff, Aig_ManCoNum(pManOff) );
    pManOff->nRegs = 0;

//    pCnfOn  = Cnf_DeriveSimple( pManOn, Aig_ManCoNum(pManOn) );
//    pCnfOff = Cnf_DeriveSimple( pManOff, Aig_ManCoNum(pManOn) );
    Cnf_DataLift( pCnfOff, pCnfOn->nVars );

    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnfOn->nVars + pCnfOff->nVars );

    // add clauses of A
    for ( i = 0; i < pCnfOn->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnfOn->pClauses[i], pCnfOn->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnfOn );
            Cnf_DataFree( pCnfOff );
            sat_solver_delete( pSat );
            return;
        }
    }

    // add clauses of B
    for ( i = 0; i < pCnfOff->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnfOff->pClauses[i], pCnfOff->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnfOn );
            Cnf_DataFree( pCnfOff );
            sat_solver_delete( pSat );
            return;
        }
    }

    // add PI clauses
    // collect the common variables
    Aig_ManForEachCi( pManOn, pObj, i )
    {
        pObj2 = Aig_ManCi( pManOff, i );

        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 0 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 1 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 1 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 0 );
        if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
            assert( 0 );
    }
    status = sat_solver_simplify( pSat );
    assert( status != 0 );

    // solve incremental SAT problems
    Aig_ManForEachCo( pManOn, pObj, i )
    {
        pObj2 = Aig_ManCo( pManOff, i );

        Lits[0] = toLitCond( pCnfOn->pVarNums[pObj->Id], 0 );
        Lits[1] = toLitCond( pCnfOff->pVarNums[pObj2->Id], 0 );
        status = sat_solver_solve( pSat, Lits, Lits+2, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status != l_False )
            printf( "The incremental SAT problem is not UNSAT.\n" );
    }
    Cnf_DataFree( pCnfOn );
    Cnf_DataFree( pCnfOff );
    sat_solver_delete( pSat );
//    ABC_PRT( "Fast interpolation time", Abc_Clock() - clk );
}